

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vendor.cpp
# Opt level: O3

void inimenu(void)

{
  long *plVar1;
  byte unaff_BL;
  int iVar2;
  int *piVar3;
  long lVar4;
  char a;
  string s;
  stringstream ss;
  ifstream fin;
  byte local_401;
  char local_3f0 [16];
  int *local_3e0;
  int *local_3d8;
  item *local_3d0;
  double local_3c8;
  long local_3c0 [2];
  ostream local_3b0 [112];
  ios_base local_340 [264];
  char local_238 [520];
  
  std::ifstream::ifstream(local_238,"menu.txt",_S_in);
  local_3f0[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
  lVar4 = 0;
LAB_00102834:
  local_3f0[0] = '\0';
  local_3e0 = &ITEM[lVar4].manu;
  local_3d0 = ITEM + lVar4;
  local_3d8 = &ITEM[lVar4].amount;
  iVar2 = 0;
  do {
    local_3c8 = (double)((char)unaff_BL + -0x30);
LAB_00102887:
    plVar1 = (long *)std::istream::get(local_238);
    if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) goto LAB_001029bf;
    if ((9 < (byte)(local_401 - 0x30)) && (0x19 < (byte)((local_401 & 0xdf) + 0xbf))) break;
    std::__cxx11::string::push_back('\0');
    unaff_BL = local_401;
  } while( true );
  if ((local_401 != 0x20) && (local_401 != 10)) goto LAB_00102887;
  switch(iVar2) {
  case 0:
    std::__cxx11::string::_M_assign((string *)local_3d0);
    break;
  case 1:
    *(double *)(local_3e0 + -3) = local_3c8;
    break;
  case 2:
    std::__ostream_insert<char,std::char_traits<char>>(local_3b0,local_3f0,0);
    piVar3 = local_3d8;
    goto LAB_0010292c;
  case 3:
    std::__ostream_insert<char,std::char_traits<char>>(local_3b0,local_3f0,0);
    piVar3 = local_3e0;
LAB_0010292c:
    std::istream::operator>>((istream *)local_3c0,piVar3);
    break;
  case 4:
    std::__ostream_insert<char,std::char_traits<char>>(local_3b0,local_3f0,0);
    std::istream::operator>>((istream *)local_3c0,&ITEM[lVar4].span);
LAB_001029bf:
    lVar4 = lVar4 + 1;
    if (lVar4 == 5) {
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
      std::ios_base::~ios_base(local_340);
      std::ifstream::~ifstream(local_238);
      return;
    }
    goto LAB_00102834;
  default:
    if (3 < iVar2) goto LAB_001029bf;
  }
  iVar2 = iVar2 + 1;
  local_3f0[0] = '\0';
  std::ios::clear((int)*(undefined8 *)(local_3c0[0] + -0x18) + (int)local_3c0);
  goto LAB_00102887;
}

Assistant:

void inimenu() {
    ifstream fin("menu.txt");
    char a, b;
    string s;
    stringstream ss;
    int i, j;

    for (i = 0; i < number; i++) {
        j = 0;
        s.erase(0);
        while (fin.get(a)) {
            if ((a >= 'a' && a <= 'z') || (a >= 'A' && a <= 'Z') || (a >= '0' && a <= '9')) {
                s += a;
                b = a;
            } else if (a == ' ' || a == '\n') {
                switch (j) {
                    case 0:
                        ITEM[i].name = s;
                        break;
                    case 1:
                        ITEM[i].price = b - '0';
                        break;
                    case 2:
                        ss << s;
                        ss >> ITEM[i].amount;
                        break;
                    case 3:
                        ss << s;
                        ss >> ITEM[i].manu;
                        break;
                    case 4:
                        ss << s;
                        ss >> ITEM[i].span;
                }
                j++;
                if (j > 4) {
                    break;
                }

                s.erase(0);
                ss.clear();
            }
        }
    }
    fin.close();
}